

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

size_t encode_ber_length_integer_count(size_t integer)

{
  undefined4 local_14;
  int bytes_used;
  size_t integer_local;
  
  local_14 = 1;
  if (0x7f < integer) {
    if (integer < 0x101) {
      local_14 = 2;
    }
    else {
      local_14 = 3;
    }
  }
  return (long)local_14;
}

Assistant:

static size_t encode_ber_length_integer_count(size_t integer){
    int bytes_used = 1;
    if(integer >= 128){
        if(integer > 256){
            bytes_used += 2;
        } else {
            bytes_used++;
        }
    }
    return bytes_used;
}